

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ch.cpp
# Opt level: O2

HRESULT GetSerializedBuffer(LPCSTR fileContents,JsFinalizeCallback fileContentFinalizeCallback,
                           JsValueRef *byteCodeBuffer)

{
  JsErrorCode jsErrorCode;
  size_t sVar1;
  PAL_FILE *pPVar2;
  LPCWSTR pWVar3;
  char16_t *format;
  JsValueRef local_30;
  JsValueRef scriptSource;
  
  sVar1 = strlen(fileContents);
  jsErrorCode = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCreateExternalArrayBuffer)
                          (fileContents,(uint)sVar1,fileContentFinalizeCallback,fileContents,
                           &local_30);
  if (jsErrorCode == JsNoError) {
    jsErrorCode = (*ChakraRTInterface::m_jsApiHooks.pfJsrtSerialize)
                            (local_30,byteCodeBuffer,JsParseScriptAttributeNone);
    if (jsErrorCode == JsNoError) {
      return 0;
    }
    pPVar2 = PAL_get_stderr(0);
    pWVar3 = Helpers::JsErrorCodeToString(jsErrorCode);
    format = 
    L"ERROR: ChakraRTInterface::JsSerialize(scriptSource, byteCodeBuffer, JsParseScriptAttributeNone) failed. JsErrorCode=0x%x (%s)\n"
    ;
  }
  else {
    pPVar2 = PAL_get_stderr(0);
    pWVar3 = Helpers::JsErrorCodeToString(jsErrorCode);
    format = 
    L"ERROR: ChakraRTInterface::JsCreateExternalArrayBuffer((void*)fileContents, (unsigned int)strlen(fileContents), fileContentFinalizeCallback, (void*)fileContents, &scriptSource) failed. JsErrorCode=0x%x (%s)\n"
    ;
  }
  PAL_fwprintf(pPVar2,format,(ulong)jsErrorCode,pWVar3);
  pPVar2 = PAL_get_stderr(0);
  PAL_fflush(pPVar2);
  return 0;
}

Assistant:

HRESULT GetSerializedBuffer(LPCSTR fileContents, JsFinalizeCallback fileContentFinalizeCallback, JsValueRef *byteCodeBuffer)
{
    HRESULT hr = S_OK;

    JsValueRef scriptSource;
    IfJsErrorFailLog(ChakraRTInterface::JsCreateExternalArrayBuffer((void*)fileContents,
        (unsigned int)strlen(fileContents), fileContentFinalizeCallback, (void*)fileContents, &scriptSource));
    IfJsErrorFailLog(ChakraRTInterface::JsSerialize(scriptSource, byteCodeBuffer,
        JsParseScriptAttributeNone));

Error:
    return hr;
}